

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::operator==(GridAxisIrregular *this,GridAxisIrregular *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = GridAxisRegular::operator!=(&this->super_GridAxisRegular,&Value->super_GridAxisRegular);
  if (!KVar1) {
    if (((double)this->m_f64CoordScaleXi == (double)Value->m_f64CoordScaleXi) &&
       (!NAN((double)this->m_f64CoordScaleXi) && !NAN((double)Value->m_f64CoordScaleXi))) {
      if (((double)this->m_f64CoordOffsetXi == (double)Value->m_f64CoordOffsetXi) &&
         (!NAN((double)this->m_f64CoordOffsetXi) && !NAN((double)Value->m_f64CoordOffsetXi))) {
        bVar2 = std::operator!=(&this->m_vXiValues,&Value->m_vXiValues);
        return !bVar2;
      }
    }
  }
  return false;
}

Assistant:

KBOOL GridAxisIrregular::operator == ( const GridAxisIrregular & Value ) const
{
    if( GridAxisRegular::operator != ( Value ) )          return false;
    if( m_f64CoordScaleXi   != Value.m_f64CoordScaleXi )  return false;
    if( m_f64CoordOffsetXi  != Value.m_f64CoordOffsetXi ) return false;
    if( m_vXiValues         != Value.m_vXiValues )        return false;
    return true;
}